

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall Engine::blockCurrentSol(Engine *this)

{
  uint uVar1;
  BoolView *this_00;
  Clause *this_01;
  int iVar2;
  Lit LVar3;
  Lit *pLVar4;
  bool bVar5;
  uint i;
  ulong uVar6;
  Clause *c;
  Clause *local_38;
  
  uVar1 = (this->outputs).sz;
  local_38 = (Clause *)malloc((long)(int)uVar1 * 4 + 8);
  *(uint *)local_38 = uVar1 << 8 | 2;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
  this_01 = local_38;
  bVar5 = true;
  for (uVar6 = 0; uVar6 < (this->outputs).sz; uVar6 = uVar6 + 1) {
    iVar2 = (*(this->outputs).data[uVar6]->_vptr_Branching[3])();
    this_00 = (BoolView *)(this->outputs).data[uVar6];
    if (iVar2 == 0) {
      LVar3 = BoolView::getValLit(this_00);
    }
    else {
      LVar3.x = (*(this_00->super_Var).super_Branching._vptr_Branching[10])();
    }
    pLVar4 = Clause::operator[](this_01,(int)uVar6);
    pLVar4->x = LVar3.x;
    pLVar4 = Clause::operator[](this_01,(int)uVar6);
    if ((engine.trail_lim.sz != 0) &&
       (*engine.trail_lim.data <= sat.trailpos.data[(uint)(pLVar4->x >> 1)])) {
      bVar5 = false;
    }
  }
  if (bVar5) {
    SAT::btToLevel(&sat,0);
  }
  sat.confl = this_01;
  return;
}

Assistant:

void Engine::blockCurrentSol() {
	Clause& c = *Reason_new(outputs.size());
	bool root_failure = true;
	for (unsigned int i = 0; i < outputs.size(); i++) {
		Var* v = (Var*)outputs[i];
		if (v->getType() == BOOL_VAR) {
			c[i] = ((BoolView*)outputs[i])->getValLit();
		} else {
			c[i] = ((IntVar*)outputs[i])->getValLit();
		}
		if (!sat.isRootLevel(var(c[i]))) {
			root_failure = false;
		}
		assert(sat.value(c[i]) == l_False);
	}
	if (root_failure) {
		sat.btToLevel(0);
	}
	sat.confl = &c;
}